

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

string * __thiscall
qpdf::BaseHandle::unparse_abi_cxx11_(string *__return_storage_ptr__,BaseHandle *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *this_00;
  bool bVar1;
  qpdf_object_type_e qVar2;
  QPDF_Bool *pQVar3;
  char *__s;
  QPDF_Integer *pQVar4;
  QPDF_String *this_01;
  string *name;
  pointer pSVar5;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_02;
  string *psVar6;
  logic_error *plVar7;
  element_type *peVar8;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  reference local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *iter;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *local_110;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *items;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  reference local_c8;
  QPDFObjectHandle *item_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range3_1;
  undefined1 local_a0 [4];
  int j_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_60;
  int local_5c;
  int j;
  int key;
  pair<const_int,_QPDFObjectHandle> *item;
  iterator __end3;
  iterator __begin3;
  map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
  *__range3;
  int next;
  QPDF_Array *a;
  BaseHandle *local_18;
  BaseHandle *this_local;
  string *result;
  
  local_18 = this;
  this_local = (BaseHandle *)__return_storage_ptr__;
  qVar2 = resolved_type_code(this);
  switch(qVar2) {
  case ot_uninitialized:
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (plVar7,"QPDFObjectHandle: attempting to unparse an uninitialized object");
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case ot_reserved:
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (plVar7,"QPDFObjectHandle: attempting to unparse a reserved object");
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case ot_null:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",(allocator<char> *)((long)&a + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&a + 3));
    break;
  case ot_boolean:
    peVar8 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    pQVar3 = std::
             get<QPDF_Bool,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&peVar8->value);
    __s = "false";
    if ((pQVar3->val & 1U) != 0) {
      __s = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)((long)&a + 2));
    std::allocator<char>::~allocator((allocator<char> *)((long)&a + 2));
    break;
  case ot_integer:
    peVar8 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    pQVar4 = std::
             get<QPDF_Integer,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&peVar8->value);
    std::__cxx11::to_string(__return_storage_ptr__,pQVar4->val);
    break;
  case ot_real:
    peVar8 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    psVar6 = (string *)
             std::
             get<QPDF_Real,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&peVar8->value);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar6);
    break;
  case ot_string:
    peVar8 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    this_01 = std::
              get<QPDF_String,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&peVar8->value);
    QPDF_String::unparse_abi_cxx11_(__return_storage_ptr__,this_01,false);
    break;
  case ot_name:
    peVar8 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    name = &std::
            get<QPDF_Name,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                      (&peVar8->value)->name;
    Name::normalize(__return_storage_ptr__,name);
    break;
  case ot_array:
    peVar8 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    _next = std::
            get<QPDF_Array,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                      (&peVar8->value);
    __range3._7_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[ ",(allocator<char> *)((long)&__range3 + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 6));
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)_next);
    if (bVar1) {
      __range3._0_4_ = 0;
      pSVar5 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
               operator->(&_next->sp);
      __end3 = std::
               map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
               ::begin(&pSVar5->elements);
      item = (pair<const_int,_QPDFObjectHandle> *)
             std::
             map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
             ::end(&pSVar5->elements);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&item), bVar1) {
        _j = std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator*(&__end3);
        local_5c = _j->first;
        for (local_60 = (int)__range3; local_60 < local_5c; local_60 = local_60 + 1) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"null ");
        }
        QPDFObjectHandle::unparse_abi_cxx11_((string *)local_a0,&_j->second);
        std::operator+(&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ," ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)local_a0);
        local_5c = local_5c + 1;
        __range3._0_4_ = local_5c;
        std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator++(&__end3);
      }
      for (__range3_1._4_4_ = (int)__range3;
          pSVar5 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                   operator->(&_next->sp), __range3_1._4_4_ < pSVar5->size;
          __range3_1._4_4_ = __range3_1._4_4_ + 1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"null ");
      }
    }
    else {
      this_02 = &_next->elements;
      __end3_1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(this_02);
      item_1 = (QPDFObjectHandle *)
               std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(this_02);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                 *)&item_1), bVar1) {
        local_c8 = __gnu_cxx::
                   __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                   ::operator*(&__end3_1);
        QPDFObjectHandle::unparse_abi_cxx11_((string *)&items,local_c8);
        std::operator+(&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&items,
                       " ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&items);
        __gnu_cxx::
        __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
        ::operator++(&__end3_1);
      }
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
    break;
  case ot_dictionary:
    peVar8 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    local_110 = &std::
                 get<QPDF_Dictionary,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                           (&peVar8->value)->items;
    __range2._7_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<< ",(allocator<char> *)((long)&__range2 + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 6));
    this_00 = local_110;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
             ::begin(local_110);
    iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
              ::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&iter), bVar1) {
      local_138 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                  ::operator*(&__end2);
      bVar1 = null(&(local_138->second).super_BaseHandle);
      if (!bVar1) {
        Name::normalize(&local_1b8,&local_138->first);
        std::operator+(&local_198,&local_1b8," ");
        QPDFObjectHandle::unparse_abi_cxx11_(&local_1d8,&local_138->second);
        std::operator+(&local_178,&local_198,&local_1d8);
        std::operator+(&local_158,&local_178," ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,">>");
    break;
  case ot_stream:
    peVar8 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    QPDFObjGen::unparse_abi_cxx11_(&local_1f8,&peVar8->og,' ');
    std::operator+(__return_storage_ptr__,&local_1f8," R");
    std::__cxx11::string::~string((string *)&local_1f8);
    break;
  case ot_operator:
    peVar8 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    psVar6 = (string *)
             std::
             get<QPDF_Operator,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&peVar8->value);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar6);
    break;
  case ot_inlineimage:
    peVar8 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    psVar6 = (string *)
             std::
             get<QPDF_InlineImage,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&peVar8->value);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar6);
    break;
  case ot_unresolved:
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (plVar7,"QPDFObjectHandle: attempting to unparse a unresolved object");
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case ot_destroyed:
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (plVar7,"attempted to unparse a QPDFObjectHandle from a destroyed QPDF");
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case ot_reference:
    peVar8 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    QPDFObjGen::unparse_abi_cxx11_(&local_218,&peVar8->og,' ');
    std::operator+(__return_storage_ptr__,&local_218," R");
    std::__cxx11::string::~string((string *)&local_218);
    break;
  default:
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
BaseHandle::unparse() const
{
    switch (resolved_type_code()) {
    case ::ot_uninitialized:
        throw std::logic_error("QPDFObjectHandle: attempting to unparse an uninitialized object");
        return ""; // does not return
    case ::ot_reserved:
        throw std::logic_error("QPDFObjectHandle: attempting to unparse a reserved object");
        return ""; // does not return
    case ::ot_null:
        return "null";
    case ::ot_boolean:
        return std::get<QPDF_Bool>(obj->value).val ? "true" : "false";
    case ::ot_integer:
        return std::to_string(std::get<QPDF_Integer>(obj->value).val);
    case ::ot_real:
        return std::get<QPDF_Real>(obj->value).val;
    case ::ot_string:
        return std::get<QPDF_String>(obj->value).unparse(false);
    case ::ot_name:
        return Name::normalize(std::get<QPDF_Name>(obj->value).name);
    case ::ot_array:
        {
            auto const& a = std::get<QPDF_Array>(obj->value);
            std::string result = "[ ";
            if (a.sp) {
                int next = 0;
                for (auto& item: a.sp->elements) {
                    int key = item.first;
                    for (int j = next; j < key; ++j) {
                        result += "null ";
                    }
                    result += item.second.unparse() + " ";
                    next = ++key;
                }
                for (int j = next; j < a.sp->size; ++j) {
                    result += "null ";
                }
            } else {
                for (auto const& item: a.elements) {
                    result += item.unparse() + " ";
                }
            }
            result += "]";
            return result;
        }
    case ::ot_dictionary:
        {
            auto const& items = std::get<QPDF_Dictionary>(obj->value).items;
            std::string result = "<< ";
            for (auto& iter: items) {
                if (!iter.second.null()) {
                    result += Name::normalize(iter.first) + " " + iter.second.unparse() + " ";
                }
            }
            result += ">>";
            return result;
        }
    case ::ot_stream:
        return obj->og.unparse(' ') + " R";
    case ::ot_operator:
        return std::get<QPDF_Operator>(obj->value).val;
    case ::ot_inlineimage:
        return std::get<QPDF_InlineImage>(obj->value).val;
    case ::ot_unresolved:
        throw std::logic_error("QPDFObjectHandle: attempting to unparse a unresolved object");
        return ""; // does not return
    case ::ot_destroyed:
        throw std::logic_error("attempted to unparse a QPDFObjectHandle from a destroyed QPDF");
        return ""; // does not return
    case ::ot_reference:
        return obj->og.unparse(' ') + " R";
    }
    return {}; // unreachable
}